

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O1

wchar_t pm(char *p,char *s,wchar_t flags)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  wchar_t wVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  bool bVar9;
  
  if ((*s == '.') && (s[1] == '/')) {
    do {
      do {
        pbVar8 = (byte *)s;
        s = (char *)(pbVar8 + 1);
      } while (*s == 0x2f);
    } while ((*s == 0x2e) && ((bVar1 = pbVar8[2], bVar1 == 0x2f || (bVar1 == 0))));
  }
  if ((*p == '.') && (p[1] == '/')) {
    do {
      do {
        pbVar8 = (byte *)p;
        p = (char *)(pbVar8 + 1);
      } while (*p == 0x2f);
    } while ((*p == 0x2e) && ((bVar1 = pbVar8[2], bVar1 == 0x2f || (bVar1 == 0))));
  }
LAB_0013b786:
  bVar1 = *p;
  if (0x3e < bVar1) {
    if (bVar1 == 0x3f) {
      if (*s == 0) goto LAB_0013ba2e;
    }
    else {
      if (bVar1 == 0x5b) {
        pbVar8 = (byte *)p + 1;
        pbVar5 = pbVar8;
        do {
          bVar6 = *pbVar5;
          if (bVar6 == 0x5c) {
            if (pbVar5[1] != 0) {
              pbVar5 = pbVar5 + 1;
            }
          }
          else {
            if (bVar6 == 0) goto LAB_0013b971;
            if (bVar6 == 0x5d) goto LAB_0013b8b6;
          }
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      if (bVar1 != 0x5c) goto LAB_0013b971;
      if (((byte *)p)[1] == 0) {
        if (*s != 0x5c) goto LAB_0013ba2e;
      }
      else {
        if (((byte *)p)[1] != *s) goto LAB_0013ba2e;
        p = (char *)((byte *)p + 1);
      }
    }
    goto LAB_0013b97c;
  }
  if (0x29 < bVar1) {
    if (bVar1 == 0x2f) {
      if ((*s == 0x2f) || (*s == 0)) {
        for (p = (char *)((byte *)p + -1);
            (bVar1 = ((byte *)p)[1], bVar1 == 0x2f ||
            ((bVar1 == 0x2e && ((((byte *)p)[2] == 0x2f || (((byte *)p)[2] == 0))))));
            p = (char *)((byte *)p + 1)) {
        }
        for (s = (char *)((byte *)s + -1);
            (((byte *)s)[1] == 0x2f ||
            ((((byte *)s)[1] == 0x2e && ((((byte *)s)[2] == 0x2f || (((byte *)s)[2] == 0))))));
            s = (char *)((byte *)s + 1)) {
        }
        if (((flags & 2U) == 0) || (bVar1 != 0)) goto LAB_0013b97c;
        goto LAB_0013b9ce;
      }
      goto LAB_0013ba2e;
    }
    if (bVar1 == 0x2a) goto LAB_0013b9c1;
LAB_0013b971:
    if (bVar1 == *s) goto LAB_0013b97c;
    goto LAB_0013ba2e;
  }
  if (bVar1 == 0x24) {
    if (((flags & 2U) != 0) && (((byte *)p)[1] == 0)) goto LAB_0013b9a9;
    goto LAB_0013b971;
  }
  if (bVar1 != 0) goto LAB_0013b971;
  if (*s != 0x2f) goto LAB_0013ba01;
  bVar9 = true;
  if ((flags & 2U) != 0) goto LAB_0013ba30;
  for (; (*s == 0x2f || ((*s == 0x2e && ((((byte *)s)[1] == 0x2f || (((byte *)s)[1] == 0))))));
      s = (char *)((byte *)s + 1)) {
  }
LAB_0013ba01:
  bVar1 = *s;
LAB_0013ba04:
  bVar9 = bVar1 == 0;
LAB_0013ba30:
  return (wchar_t)bVar9;
LAB_0013b8b6:
  bVar3 = false;
  bVar9 = true;
  if (((*pbVar8 == 0x5e) || (*pbVar8 == 0x21)) && (pbVar8 < pbVar5)) {
    pbVar8 = (byte *)p + 2;
    bVar3 = true;
    bVar9 = false;
  }
  bVar2 = bVar3;
  if (pbVar8 < pbVar5) {
    bVar1 = *s;
    bVar6 = 0;
    do {
      bVar2 = bVar9;
      if (*pbVar8 == 0x5c) {
        pbVar8 = pbVar8 + 1;
LAB_0013b921:
        bVar6 = *pbVar8;
        if (bVar6 == bVar1) break;
      }
      else {
        if (*pbVar8 != 0x2d) goto LAB_0013b921;
        if ((bVar6 == 0) || (pbVar8 == pbVar5 + -1)) {
          if (bVar1 == 0x2d) break;
        }
        else {
          bVar7 = pbVar8[1];
          if (bVar7 == 0x5c) {
            bVar7 = pbVar8[2];
            pbVar8 = pbVar8 + 2;
          }
          else {
            pbVar8 = pbVar8 + 1;
          }
          if ((char)bVar1 <= (char)bVar7 && (char)bVar6 <= (char)bVar1) break;
        }
        bVar6 = 0;
      }
      pbVar8 = pbVar8 + 1;
      bVar2 = bVar3;
    } while (pbVar8 < pbVar5);
  }
  p = (char *)pbVar5;
  if (!bVar2) goto LAB_0013ba2e;
LAB_0013b97c:
  p = (char *)((byte *)p + 1);
  s = (char *)((byte *)s + 1);
  goto LAB_0013b786;
LAB_0013b9a9:
  do {
    do {
      pbVar8 = (byte *)s + 1;
      bVar1 = *s;
      s = (char *)pbVar8;
    } while (bVar1 == 0x2f);
  } while ((bVar1 == 0x2e) && ((*pbVar8 == 0x2f || (*pbVar8 == 0))));
  goto LAB_0013ba04;
LAB_0013b9c1:
  for (; *p == 0x2a; p = (char *)((byte *)p + 1)) {
  }
  if (*p == 0) {
LAB_0013b9ce:
    bVar9 = true;
  }
  else if (*s == 0) {
LAB_0013ba2e:
    bVar9 = false;
  }
  else {
    do {
      wVar4 = __archive_pathmatch(p,s,flags);
      bVar9 = wVar4 != L'\0';
      if (bVar9) break;
      pbVar8 = (byte *)s + 1;
      s = (char *)((byte *)s + 1);
    } while (*pbVar8 != 0);
  }
  goto LAB_0013ba30;
}

Assistant:

static int
pm(const char *p, const char *s, int flags)
{
	const char *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == '.' && s[1] == '/')
		s = pm_slashskip(s + 1);
	if (p[0] == '.' && p[1] == '/')
		p = pm_slashskip(p + 1);

	for (;;) {
		switch (*p) {
		case '\0':
			if (s[0] == '/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip(s);
			}
			return (*s == '\0');
		case '?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == '\0')
				return (0);
			break;
		case '*':
			/* "*" == "**" == "***" ... */
			while (*p == '*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == '\0')
				return (1);
			while (*s) {
				if (archive_pathmatch(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case '[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != '\0' && *end != ']') {
				if (*end == '\\' && end[1] != '\0')
					++end;
				++end;
			}
			if (*end == ']') {
				/* We found [...], try to match it. */
				if (!pm_list(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case '\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == '\0') {
				if (*s != '\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case '/':
			if (*s != '/' && *s != '\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip(p);
			s = pm_slashskip(s);
			if (*p == '\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case '$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == '\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip(s) == '\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}